

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

bool utilities::replace(string *str,string *from,string *to)

{
  ulong uVar1;
  
  uVar1 = std::__cxx11::string::find((string *)str,(ulong)from);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)str,uVar1,(string *)from->_M_string_length);
  }
  return uVar1 != 0xffffffffffffffff;
}

Assistant:

bool replace(std::string& str, const std::string& from, const std::string& to)
    {
        size_t start_pos = str.find(from);
        if(start_pos == std::string::npos)
        {
            return false;
        }
        str.replace(start_pos, from.length(), to);
        return true;
    }